

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_audio.c
# Opt level: O1

void ws_audio_update(void *info,UINT32 length,DEV_SMPL **buffer)

{
  ushort uVar1;
  DEV_SMPL *pDVar2;
  DEV_SMPL *pDVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  char cVar9;
  byte bVar10;
  byte bVar11;
  ushort uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  ushort *puVar20;
  byte *pbVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  long lVar25;
  int iVar26;
  
  if (length != 0) {
    pDVar2 = *buffer;
    pDVar3 = buffer[1];
    lVar4 = *(long *)((long)info + 0x48);
    uVar19 = *(ulong *)((long)info + 0x50);
    uVar1 = *(ushort *)((long)info + 0x68);
    uVar22 = 0;
    do {
      uVar19 = uVar19 + lVar4;
      *(ulong *)((long)info + 0x50) = uVar19;
      uVar15 = uVar19 >> 0x20;
      if (uVar15 != 0) {
        do {
          if ((*(char *)((long)info + 0x5a) != '\0') && ((*(byte *)((long)info + 0xfc) & 0x40) != 0)
             ) {
            if (*(short *)((long)info + 0x5c) < 0) {
              *(undefined2 *)((long)info + 0x5c) = *(undefined2 *)((long)info + 0x58);
              uVar7 = (ushort)(*(short *)((long)info + 0x5e) + (short)*(char *)((long)info + 0x5a))
                      & 0x7ff;
              *(short *)((long)info + 0x5e) = (short)uVar7;
              *(int *)((long)info + 0x30) =
                   (int)(long)((1.0 / (float)(int)(0x800 - uVar7)) * *(float *)((long)info + 0x180))
              ;
            }
            *(short *)((long)info + 0x5c) = *(short *)((long)info + 0x5c) + -1;
          }
          uVar7 = (int)uVar15 - 1;
          uVar15 = (ulong)uVar7;
        } while (uVar7 != 0);
      }
      uVar19 = uVar19 & 0xffffffff;
      *(ulong *)((long)info + 0x50) = uVar19;
      lVar25 = 0;
      iVar18 = 0;
      iVar26 = 0;
      do {
        if (*(char *)((long)info + lVar25 * 0x10 + 0x15) == '\0') {
          if ((lVar25 == 1) && ((*(byte *)((long)info + 0xfc) & 0x20) != 0)) {
            iVar14 = *(byte *)((long)info + 0xf5) - 0x80;
            iVar16 = (uint)*(byte *)((long)info + 0x6a) * iVar14;
            pbVar21 = (byte *)((long)info + 0x6b);
          }
          else {
            if ((*(byte *)((long)info + 0xfc) >> ((uint)lVar25 & 0x1f) & 1) == 0) goto LAB_00168201;
            puVar20 = (ushort *)((long)info + lVar25 * 0x10 + 8);
            uVar7 = *(int *)(puVar20 + 2) + *(int *)(puVar20 + 4);
            uVar13 = uVar7 >> 0x10;
            cVar9 = (char)(uVar7 >> 0x10);
            if ((char)*(byte *)((long)info + 0xfc) < '\0' && lVar25 == 3) {
              *(uint *)(puVar20 + 2) = uVar7 & 0xffff;
              if (cVar9 != '\0') {
                uVar7 = ws_audio_update::noise_bit[*(byte *)((long)info + 0x60)] - 1;
                uVar24 = *(uint *)((long)info + 100);
                do {
                  uVar24 = uVar24 & uVar7;
                  if (uVar24 == 0) {
                    uVar24 = uVar7;
                  }
                  if ((uVar24 & ws_audio_update::noise_mask[*(byte *)((long)info + 0x60)]) == 0) {
                    uVar23 = 0;
                  }
                  else {
                    uVar23 = uVar24 & ws_audio_update::noise_mask[*(byte *)((long)info + 0x60)];
                    uVar6 = 0;
                    do {
                      uVar17 = uVar6;
                      uVar8 = uVar23 & 1;
                      bVar5 = 1 < uVar23;
                      uVar23 = uVar23 >> 1;
                      uVar6 = uVar17 ^ uVar8;
                    } while (bVar5);
                    uVar23 = ws_audio_update::noise_bit[*(byte *)((long)info + 0x60)];
                    if (uVar17 == uVar8) {
                      uVar23 = 0;
                    }
                  }
                  bVar11 = (char)uVar13 - 1;
                  uVar13 = (uint)bVar11;
                  uVar24 = (uVar24 | uVar23) >> 1;
                } while (bVar11 != 0);
                *(uint *)((long)info + 100) = uVar24;
              }
              uVar7 = *(uint *)((long)info + 100);
              *(char *)((long)info + 0xfe) = (char)uVar7;
              *(byte *)((long)info + 0xff) = (byte)(uVar7 >> 8) & 0x7f;
              uVar13 = (uint)(byte)puVar20[1];
              iVar14 = 0x7f;
              if ((uVar7 & 1) == 0) {
                iVar14 = -0x80;
              }
            }
            else {
              *(uint *)(puVar20 + 2) = uVar7 & 0xffff;
              bVar10 = cVar9 + (char)puVar20[6];
              bVar11 = bVar10 & 0x1f;
              *(byte *)(puVar20 + 6) = bVar11;
              bVar11 = *(byte *)(*(long *)((long)info + 0x170) +
                                ((ulong)(bVar11 >> 1) | (ulong)(*puVar20 & 0xfffffff0)));
              uVar12 = (bVar11 & 0xf) << 4;
              if ((bVar10 & 1) != 0) {
                uVar12 = bVar11 & 0xfff0;
              }
              uVar13 = (uint)(byte)puVar20[1];
              iVar14 = (int)(short)(uVar12 - 0x80);
            }
            iVar16 = uVar13 * iVar14;
            pbVar21 = (byte *)((long)puVar20 + 3);
          }
          iVar26 = iVar26 + iVar16;
          iVar18 = iVar18 + (uint)*pbVar21 * iVar14;
        }
LAB_00168201:
        lVar25 = lVar25 + 1;
      } while (lVar25 != 4);
      pDVar2[uVar22] = iVar26 * (uint)uVar1;
      pDVar3[uVar22] = iVar18 * (uint)uVar1;
      uVar22 = uVar22 + 1;
    } while (uVar22 != length);
  }
  return;
}

Assistant:

static void ws_audio_update(void* info, UINT32 length, DEV_SMPL** buffer)
{
	wsa_state* chip = (wsa_state*)info;
	DEV_SMPL* bufL;
	DEV_SMPL* bufR;
	UINT32 i;
	UINT8 ch, cnt;
	INT16 w;	// could fit into INT8
	DEV_SMPL l, r;

	bufL = buffer[0];
	bufR = buffer[1];
	for (i=0; i<length; i++)
	{
		UINT32 swpCount;
		
		RC_STEP(&chip->HBlankTmr);
		for (swpCount = RC_GET_VAL(&chip->HBlankTmr); swpCount > 0; swpCount --)
			ws_audio_process(chip);
		RC_MASK(&chip->HBlankTmr);

		l = r = 0;

		for (ch=0; ch<4; ch++)
		{
			if (chip->ws_audio[ch].Muted)
				continue;
			
			if ((ch==1) && (SNDMOD&0x20))
			{
				// Voice出力
				w = chip->ws_ioRam[0x89];
				w -= 0x80;
				l += chip->PCMVolumeLeft  * w;
				r += chip->PCMVolumeRight * w;
			}
			else if (SNDMOD&(1<<ch))
			{
				if ((ch==3) && (SNDMOD&0x80))
				{
					//Noise

					//OSWANの擬似乱数の処理と同等のつもり
#define BIT(n) (1<<n)
					static const UINT32 noise_mask[8] =
					{
						BIT(0)|BIT(1),
						BIT(0)|BIT(1)|BIT(4)|BIT(5),
						BIT(0)|BIT(1)|BIT(3)|BIT(4),
						BIT(0)|BIT(1)|BIT(4)|BIT(6),
						BIT(0)|BIT(2),
						BIT(0)|BIT(3),
						BIT(0)|BIT(4),
						BIT(0)|BIT(2)|BIT(3)|BIT(4)
					};

					static const UINT32 noise_bit[8] =
					{
						BIT(15),
						BIT(14),
						BIT(13),
						BIT(12),
						BIT(11),
						BIT(10),
						BIT(9),
						BIT(8)
					};

					UINT32 Masked, XorReg;

					chip->ws_audio[ch].offset += chip->ws_audio[ch].delta;
					cnt = chip->ws_audio[ch].offset>>16;
					chip->ws_audio[ch].offset &= 0xffff;
					while (cnt > 0)
					{
						cnt--;

						chip->NoiseRng &= noise_bit[chip->NoiseType]-1;
						if (!chip->NoiseRng) chip->NoiseRng = noise_bit[chip->NoiseType]-1;

						Masked = chip->NoiseRng & noise_mask[chip->NoiseType];
						XorReg = 0;
						while (Masked)
						{
							XorReg ^= Masked&1;
							Masked >>= 1;
						}
						if (XorReg)
							chip->NoiseRng |= noise_bit[chip->NoiseType];
						chip->NoiseRng >>= 1;
					}

					PCSRL = (byte)(chip->NoiseRng&0xff);
					PCSRH = (byte)((chip->NoiseRng>>8)&0x7f);

					w = (chip->NoiseRng&1)? 0x7f:-0x80;
					l += chip->ws_audio[ch].lvol * w;
					r += chip->ws_audio[ch].rvol * w;
				}
				else
				{
					chip->ws_audio[ch].offset += chip->ws_audio[ch].delta;
					cnt = chip->ws_audio[ch].offset>>16;
					chip->ws_audio[ch].offset &= 0xffff;
					chip->ws_audio[ch].pos += cnt;
					chip->ws_audio[ch].pos &= 0x1f;
					w = chip->ws_internalRam[(chip->ws_audio[ch].wave&0xFFF0) + (chip->ws_audio[ch].pos>>1)];
					if ((chip->ws_audio[ch].pos&1) == 0)
						w = (w<<4)&0xf0;	//下位ニブル
					else
						w = w&0xf0;			//上位ニブル
					w -= 0x80;
					l += chip->ws_audio[ch].lvol * w;
					r += chip->ws_audio[ch].rvol * w;
				}
			}
		}

		bufL[i] = l * chip->MainVolume;
		bufR[i] = r * chip->MainVolume;
	}
}